

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::HttpServer::Connection::~Connection(Connection *this)

{
  uint uVar1;
  PromiseFulfiller<void> *pPVar2;
  undefined1 local_31;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_30;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *f;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_18;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_f7388;
  Connection *this_local;
  
  uVar1 = this->server->connectionCount - 1;
  this->server->connectionCount = uVar1;
  _f7388 = (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)this;
  if ((uVar1 == 0) &&
     (local_18 = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>
                           (&this->server->zeroConnectionsFulfiller),
     local_18 != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0)) {
    local_30 = local_18;
    pPVar2 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(local_18);
    (*(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar2,&local_31);
  }
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&this->tunnelWriteGuard);
  Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::~Maybe(&this->tunnelRejected);
  Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::~Maybe(&this->webSocketError);
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::~Maybe(&this->currentMethod);
  anon_unknown_36::HttpOutputStream::~HttpOutputStream(&this->httpOutput);
  anon_unknown_36::HttpInputStreamImpl::~HttpInputStreamImpl(&this->httpInput);
  Function<kj::Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_>_(kj::HttpServer::SuspendableRequest_&)>
  ::~Function(&this->factory);
  return;
}

Assistant:

~Connection() noexcept(false) {
    if (--server.connectionCount == 0) {
      KJ_IF_SOME(f, server.zeroConnectionsFulfiller) {
        f->fulfill();
      }
    }
  }